

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O0

uint32_t __thiscall absl::lts_20250127::base_internal::SpinLock::SpinLoop(SpinLock *this)

{
  bool bVar1;
  int local_30;
  uint32_t lock_value;
  int c;
  SpinLock *this_local;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  _c = this;
  LowLevelCallOnce<absl::lts_20250127::base_internal::SpinLock::SpinLoop()::__0>
            (&SpinLoop::init_adaptive_spin_count,(anon_class_1_0_00000001 *)((long)&lock_value + 3))
  ;
  local_30 = SpinLoop::adaptive_spin_count;
  do {
    local_14 = 0;
    ___b = this;
    local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_14 - 1U < 2) {
      this_local._4_4_ = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    }
    else if (local_14 == 5) {
      this_local._4_4_ = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    }
    else {
      this_local._4_4_ = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    }
    bVar1 = false;
    if ((this_local._4_4_ & 1) != 0) {
      local_30 = local_30 + -1;
      bVar1 = 0 < local_30;
    }
  } while (bVar1);
  return this_local._4_4_;
}

Assistant:

uint32_t SpinLock::SpinLoop() {
  // We are already in the slow path of SpinLock, initialize the
  // adaptive_spin_count here.
  ABSL_CONST_INIT static absl::once_flag init_adaptive_spin_count;
  ABSL_CONST_INIT static int adaptive_spin_count = 0;
  base_internal::LowLevelCallOnce(&init_adaptive_spin_count, []() {
    adaptive_spin_count = base_internal::NumCPUs() > 1 ? 1000 : 1;
  });

  int c = adaptive_spin_count;
  uint32_t lock_value;
  do {
    lock_value = lockword_.load(std::memory_order_relaxed);
  } while ((lock_value & kSpinLockHeld) != 0 && --c > 0);
  return lock_value;
}